

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::AddScriptedCommand(cmState *this,string *name,cmCommand *command)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
  *pmVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  cmCommand *pcVar4;
  iterator iVar5;
  undefined4 extraout_var;
  string sName;
  string newName;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>
  local_90;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  cmsys::SystemTools::LowerCase(&local_68,name);
  pcVar4 = GetCommand(this,&local_68);
  if (pcVar4 != (cmCommand *)0x0) {
    std::operator+(&local_48,"_",&local_68);
    pmVar1 = &this->ScriptedCommands;
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
            ::find(&pmVar1->_M_t,&local_48);
    if ((_Rb_tree_header *)iVar5._M_node !=
        &(this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header) {
      if (*(long **)(iVar5._M_node + 2) != (long *)0x0) {
        (**(code **)(**(long **)(iVar5._M_node + 2) + 8))();
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                          *)pmVar1,iVar5);
    }
    iVar3 = (*pcVar4->_vptr_cmCommand[6])(pcVar4);
    paVar2 = &local_90.first.field_2;
    local_90.first._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_48._M_dataplus._M_p,
               local_48._M_dataplus._M_p + local_48._M_string_length);
    local_90.second = (cmCommand *)CONCAT44(extraout_var,iVar3);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,cmCommand*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                *)pmVar1,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_90.first._M_dataplus._M_p,
                      local_90.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  pmVar1 = &this->ScriptedCommands;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
          ::find(&pmVar1->_M_t,&local_68);
  if ((_Rb_tree_header *)iVar5._M_node !=
      &(this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header) {
    if (*(long **)(iVar5._M_node + 2) != (long *)0x0) {
      (**(code **)(**(long **)(iVar5._M_node + 2) + 8))();
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                        *)pmVar1,iVar5);
  }
  paVar2 = &local_90.first.field_2;
  local_90.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  local_90.second = command;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,cmCommand*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
              *)pmVar1,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmState::AddScriptedCommand(std::string const& name, cmCommand* command)
{
  std::string sName = cmSystemTools::LowerCase(name);

  // if the command already exists, give a new name to the old command.
  if (cmCommand* oldCmd = this->GetCommand(sName)) {
    std::string const newName = "_" + sName;
    std::map<std::string, cmCommand*>::iterator pos =
      this->ScriptedCommands.find(newName);
    if (pos != this->ScriptedCommands.end()) {
      delete pos->second;
      this->ScriptedCommands.erase(pos);
    }
    this->ScriptedCommands.insert(std::make_pair(newName, oldCmd->Clone()));
  }

  // if the command already exists, free the old one
  std::map<std::string, cmCommand*>::iterator pos =
    this->ScriptedCommands.find(sName);
  if (pos != this->ScriptedCommands.end()) {
    delete pos->second;
    this->ScriptedCommands.erase(pos);
  }
  this->ScriptedCommands.insert(std::make_pair(sName, command));
}